

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

Table * __thiscall woff2::Font::FindTable(Font *this,uint32_t tag)

{
  bool bVar1;
  pointer ppVar2;
  Table *local_38;
  _Self local_28;
  _Self local_20;
  iterator it;
  uint32_t tag_local;
  Font *this_local;
  
  it._M_node._4_4_ = tag;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
       ::find(&this->tables,(key_type *)((long)&it._M_node + 4));
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
       ::end(&this->tables);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    local_38 = (Table *)0x0;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::operator->
                       (&local_20);
    local_38 = &ppVar2->second;
  }
  return local_38;
}

Assistant:

Font::Table* Font::FindTable(uint32_t tag) {
  std::map<uint32_t, Font::Table>::iterator it = tables.find(tag);
  return it == tables.end() ? 0 : &it->second;
}